

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Table * sqlite3LocateTableItem(Parse *pParse,u32 flags,SrcItem *p)

{
  sqlite3 *db;
  int iVar1;
  Db *pDVar2;
  Table *pTVar3;
  
  if (((p->fg).field_0x3 & 1) == 0) {
    pDVar2 = (Db *)&p->u4;
  }
  else {
    db = pParse->db;
    iVar1 = sqlite3SchemaToIndex(db,(p->u4).pSchema);
    pDVar2 = db->aDb + iVar1;
  }
  pTVar3 = sqlite3LocateTable(pParse,flags,p->zName,pDVar2->zDbSName);
  return pTVar3;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTableItem(
  Parse *pParse,
  u32 flags,
  SrcItem *p
){
  const char *zDb;
  if( p->fg.fixedSchema ){
    int iDb = sqlite3SchemaToIndex(pParse->db, p->u4.pSchema);
    zDb = pParse->db->aDb[iDb].zDbSName;
  }else{
    assert( !p->fg.isSubquery );
    zDb = p->u4.zDatabase;
  }
  return sqlite3LocateTable(pParse, flags, p->zName, zDb);
}